

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O2

void __thiscall GetOpt::GetOpt_pp::TokensDeleter::~TokensDeleter(TokensDeleter *this)

{
  Token *pTVar1;
  Token *pTVar2;
  
  pTVar2 = *this->_first;
  while (pTVar2 != (Token *)0x0) {
    pTVar1 = pTVar2->next;
    std::__cxx11::string::~string((string *)&pTVar2->value);
    operator_delete(pTVar2);
    pTVar2 = pTVar1;
  }
  return;
}

Assistant:

GETOPT_INLINE GetOpt_pp::TokensDeleter::~TokensDeleter()
{
    Token* next;
    Token* current(_first);
    while (current != NULL)
    {
        next = current->next;
        delete current;
        current = next;
    }
}